

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.cpp
# Opt level: O2

ggml_status ggml_backend_cpu_graph_compute(ggml_backend_t backend,ggml_cgraph *cgraph)

{
  int *piVar1;
  ggml_status gVar2;
  ggml_cplan local_48;
  
  piVar1 = (int *)backend->context;
  ggml_graph_plan(&local_48,cgraph,*piVar1,*(ggml_threadpool **)(piVar1 + 2));
  local_48.work_data = *(uint8_t **)(piVar1 + 4);
  if (*(ulong *)(piVar1 + 6) < local_48.work_size) {
    if (local_48.work_data != (uint8_t *)0x0) {
      operator_delete__(local_48.work_data);
    }
    local_48.work_data = (uint8_t *)operator_new__(local_48.work_size);
    *(uint8_t **)(piVar1 + 4) = local_48.work_data;
    *(size_t *)(piVar1 + 6) = local_48.work_size;
  }
  local_48.abort_callback = *(ggml_abort_callback *)(piVar1 + 8);
  local_48.abort_callback_data = *(void **)(piVar1 + 10);
  gVar2 = ggml_graph_compute(cgraph,&local_48);
  return gVar2;
}

Assistant:

static enum ggml_status ggml_backend_cpu_graph_compute(ggml_backend_t backend, struct ggml_cgraph * cgraph) {
    struct ggml_backend_cpu_context * cpu_ctx = (struct ggml_backend_cpu_context *)backend->context;

    struct ggml_cplan cplan = ggml_graph_plan(cgraph, cpu_ctx->n_threads, cpu_ctx->threadpool);

    if (cpu_ctx->work_size < cplan.work_size) {
        delete[] cpu_ctx->work_data;
        cpu_ctx->work_data = new uint8_t[cplan.work_size];
        if (cpu_ctx->work_data == NULL) {
            cpu_ctx->work_size = 0;
            return GGML_STATUS_ALLOC_FAILED;
        }
        cpu_ctx->work_size = cplan.work_size;
    }
    cplan.work_data = (uint8_t *)cpu_ctx->work_data;

    cplan.abort_callback      = cpu_ctx->abort_callback;
    cplan.abort_callback_data = cpu_ctx->abort_callback_data;

    return ggml_graph_compute(cgraph, &cplan);
}